

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O1

bool __thiscall Minisat::OnlineProofChecker::propagate(OnlineProofChecker *this)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  byte bVar6;
  long lVar7;
  ulong *puVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  uint *puVar12;
  Lit LVar13;
  long lVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  uint local_74;
  Watcher local_60;
  uint *local_58;
  long local_50;
  ulong local_48;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_40;
  ulong *local_38;
  
  local_40 = (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (this + 0x58);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (local_40);
  if (3 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ... ",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  if (4 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ",0x18);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*(int *)(this + 0x38));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," units",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (0 < *(int *)(this + 0x38)) {
    lVar7 = 0;
    do {
      LVar13.x = *(int *)(*(long *)(this + 0x30) + lVar7 * 4);
      bVar2 = *(byte *)(*(long *)(this + 0xd8) + (long)(LVar13.x >> 1));
      bVar6 = (byte)LVar13.x & 1;
      bVar18 = false;
      if ((bVar2 != bVar6) && (bVar18 = true, (bVar2 ^ bVar6) != 1)) {
        uncheckedEnqueue(this,LVar13);
        bVar18 = false;
      }
      if (bVar18) {
        return true;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this + 0x38));
  }
  iVar4 = *(int *)(this + 0xb0);
  if (iVar4 < *(int *)(this + 0xc0)) {
    local_74 = 0xffffffff;
    do {
      *(int *)(this + 0xb0) = iVar4 + 1;
      uVar3 = *(uint *)(*(long *)(this + 0xb8) + (long)iVar4 * 4);
      if (5 < *(int *)(this + 0xf8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate lit ",0x1c);
        uVar17 = ~((int)uVar3 >> 1);
        if (((long)(int)uVar3 & 1U) == 0) {
          uVar17 = ((int)uVar3 >> 1) + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar17);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      puVar8 = (ulong *)((long)(int)uVar3 * 0x10 + *(long *)(this + 0x58));
      if (6 < *(int *)(this + 0xf8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with ",0x1d);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)puVar8[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," longer clauses",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      puVar9 = (uint *)*puVar8;
      puVar1 = puVar9 + (long)(int)puVar8[1] * 2;
      local_48 = (ulong)(uVar3 ^ 1);
      puVar15 = puVar9;
      local_38 = puVar8;
      do {
        if (puVar15 == puVar1) break;
        if (7 < *(int *)(this + 0xf8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with clause ",0x24);
          if (0x3ffffffff < *(ulong *)(*(long *)(this + 8) + (ulong)*puVar15 * 4)) {
            puVar8 = (ulong *)(*(long *)(this + 8) + (ulong)*puVar15 * 4);
            uVar16 = 0;
            do {
              uVar3 = *(uint *)((long)puVar8 + uVar16 * 4 + 8);
              uVar11 = (int)uVar3 >> 1;
              uVar17 = ~uVar11;
              if ((uVar3 & 1) == 0) {
                uVar17 = uVar11 + 1;
              }
              std::ostream::operator<<((ostream *)&std::cerr,uVar17);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
              uVar16 = uVar16 + 1;
            } while (uVar16 < *puVar8 >> 0x22);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
        }
        uVar3 = puVar15[1];
        uVar17 = (int)uVar3 >> 1;
        lVar7 = *(long *)(this + 0xd8);
        if (*(byte *)(lVar7 + (int)uVar17) == ((byte)uVar3 & 1)) {
          if (8 < *(int *)(this + 0xf8)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by blocker ",0x28);
            uVar11 = ~uVar17;
            if ((uVar3 & 1) == 0) {
              uVar11 = uVar17 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar11);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
            if (0x3ffffffff < *(ulong *)(*(long *)(this + 8) + (ulong)*puVar15 * 4)) {
              puVar8 = (ulong *)(*(long *)(this + 8) + (ulong)*puVar15 * 4);
              uVar16 = 0;
              do {
                uVar3 = *(uint *)((long)puVar8 + uVar16 * 4 + 8);
                uVar11 = (int)uVar3 >> 1;
                uVar17 = ~uVar11;
                if ((uVar3 & 1) == 0) {
                  uVar17 = uVar11 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar16 = uVar16 + 1;
              } while (uVar16 < *puVar8 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
            std::ostream::put(' ');
            std::ostream::flush();
          }
          *(undefined8 *)puVar9 = *(undefined8 *)puVar15;
          puVar9 = puVar9 + 2;
LAB_0010beae:
          bVar18 = false;
          puVar15 = puVar15 + 2;
        }
        else {
          local_60.cref = *puVar15;
          puVar12 = (uint *)(ulong)local_60.cref;
          lVar14 = *(long *)(this + 8);
          puVar8 = (ulong *)(lVar14 + (long)puVar12 * 4);
          if ((int)puVar8[1] == (int)local_48) {
            *(undefined4 *)(puVar8 + 1) = *(undefined4 *)((long)puVar8 + 0xc);
            *(int *)((long)puVar8 + 0xc) = (int)local_48;
          }
          LVar13.x = (int)puVar8[1];
          uVar17 = LVar13.x >> 1;
          local_60.blocker.x = LVar13.x;
          if ((LVar13.x != uVar3) && (*(byte *)(lVar7 + (int)uVar17) == ((byte)LVar13.x & 1))) {
            if (8 < *(int *)(this + 0xf8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by other watch ",0x2c);
              uVar3 = ~uVar17;
              if ((LVar13.x & 1U) == 0) {
                uVar3 = uVar17 + 1;
              }
              std::ostream::operator<<((ostream *)&std::cerr,uVar3);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
              if (0x3ffffffff < *puVar8) {
                uVar16 = 0;
                do {
                  uVar3 = *(uint *)((long)puVar8 + uVar16 * 4 + 8);
                  uVar11 = (int)uVar3 >> 1;
                  uVar17 = ~uVar11;
                  if ((uVar3 & 1) == 0) {
                    uVar17 = uVar11 + 1;
                  }
                  std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                  uVar16 = uVar16 + 1;
                } while (uVar16 < *puVar8 >> 0x22);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
              std::ostream::put(' ');
              std::ostream::flush();
            }
            *(ulong *)puVar9 = CONCAT44(local_60.blocker.x,local_60.cref);
LAB_0010beac:
            puVar9 = puVar9 + 2;
            goto LAB_0010beae;
          }
          if (2 < (uint)(*puVar8 >> 0x22)) {
            lVar14 = lVar14 + (long)puVar12 * 4 + 0x10;
            lVar10 = 0;
LAB_0010bd1f:
            iVar4 = *(int *)(lVar14 + lVar10 * 4);
            if (((byte)iVar4 & 1 ^ *(byte *)(lVar7 + (iVar4 >> 1))) == 1) goto code_r0x0010bd39;
            if (8 < *(int *)(this + 0xf8)) {
              local_58 = puVar9;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"c [DRAT-OTFC] found new watch for the clause: ",0x2e
                        );
              uVar3 = *(uint *)(lVar14 + lVar10 * 4);
              uVar11 = (int)uVar3 >> 1;
              uVar17 = ~uVar11;
              if ((uVar3 & 1) == 0) {
                uVar17 = uVar11 + 1;
              }
              local_50 = lVar14;
              std::ostream::operator<<((ostream *)&std::cerr,uVar17);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
              if (0x3ffffffff < *puVar8) {
                uVar16 = 0;
                do {
                  uVar3 = *(uint *)((long)puVar8 + uVar16 * 4 + 8);
                  uVar11 = (int)uVar3 >> 1;
                  uVar17 = ~uVar11;
                  if ((uVar3 & 1) == 0) {
                    uVar17 = uVar11 + 1;
                  }
                  std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                  uVar16 = uVar16 + 1;
                } while (uVar16 < *puVar8 >> 0x22);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
              std::ostream::put(' ');
              std::ostream::flush();
              puVar9 = local_58;
              lVar14 = local_50;
            }
            *(undefined4 *)((long)puVar8 + 0xc) = *(undefined4 *)(lVar14 + lVar10 * 4);
            *(int *)(lVar14 + lVar10 * 4) = (int)local_48;
            vec<Minisat::Watcher>::push
                      ((vec<Minisat::Watcher> *)
                       (((long)*(int *)((long)puVar8 + 0xc) ^ 1U) * 0x10 + *(long *)local_40),
                       &local_60);
            goto LAB_0010beae;
          }
LAB_0010bd41:
          *(ulong *)puVar9 = CONCAT44(LVar13.x,local_60.cref);
          if (((byte)LVar13.x & 1 ^ *(byte *)(*(long *)(this + 0xd8) + (long)(int)uVar17)) != 1) {
            if (8 < *(int *)(this + 0xf8)) {
              local_58 = puVar12;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue ",0x16);
              local_50 = CONCAT44(local_50._4_4_,LVar13.x);
              uVar3 = ~uVar17;
              if ((LVar13.x & 1U) == 0) {
                uVar3 = uVar17 + 1;
              }
              std::ostream::operator<<((ostream *)&std::cerr,uVar3);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," with reason ",0xd);
              if (0x3ffffffff < *(ulong *)(*(long *)(this + 8) + (long)local_58 * 4)) {
                puVar8 = (ulong *)(*(long *)(this + 8) + (long)local_58 * 4);
                uVar16 = 0;
                do {
                  uVar3 = *(uint *)((long)puVar8 + uVar16 * 4 + 8);
                  uVar11 = (int)uVar3 >> 1;
                  uVar17 = ~uVar11;
                  if ((uVar3 & 1) == 0) {
                    uVar17 = uVar11 + 1;
                  }
                  std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                  uVar16 = uVar16 + 1;
                } while (uVar16 < *puVar8 >> 0x22);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
              std::ostream::put(' ');
              std::ostream::flush();
              LVar13.x = (int)local_50;
            }
            uncheckedEnqueue(this,LVar13);
            goto LAB_0010beac;
          }
          *(undefined4 *)(this + 0xb0) = *(undefined4 *)(this + 0xc0);
          bVar18 = true;
          while( true ) {
            puVar15 = puVar15 + 2;
            puVar9 = puVar9 + 2;
            local_74 = local_60.cref;
            if (puVar1 <= puVar15) break;
            *(undefined8 *)puVar9 = *(undefined8 *)puVar15;
          }
        }
      } while (!bVar18);
      *(int *)(local_38 + 1) = (int)local_38[1] - (int)((ulong)((long)puVar15 - (long)puVar9) >> 3);
      iVar4 = *(int *)(this + 0xb0);
    } while (iVar4 < *(int *)(this + 0xc0));
    bVar18 = local_74 != 0xffffffff;
  }
  else {
    bVar18 = false;
  }
  if (5 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate returns ",0x20);
    poVar5 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return bVar18;
code_r0x0010bd39:
  lVar10 = lVar10 + 1;
  if ((*puVar8 >> 0x22) - 2 == lVar10) goto LAB_0010bd41;
  goto LAB_0010bd1f;
}

Assistant:

inline bool OnlineProofChecker::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();

    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] propagate ... " << std::endl;);

    // propagate units first!
    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] propagate " << unitClauses.size() << " units" << std::endl;);
    for (int i = 0; i < unitClauses.size(); ++i) { // propagate all known units
        const Lit l = unitClauses[i];
        if (value(l) == l_True) {
            continue;
        } else if (value(l) == l_False) {
            return true;
        } else {
            uncheckedEnqueue(l);
        }
    }


    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        num_props++;
        DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate lit " << p << std::endl;);

        vec<Watcher> &ws = watches[p];
        DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] propagate with " << ws.size() << " longer clauses" << std::endl;);
        Watcher *i, *j, *end;
        // propagate longer clauses here!
        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            DOUT(if (verbose > 7) std::cerr << "c [DRAT-OTFC] propagate with clause " << ca[i->cref] << std::endl;);

            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) { // keep binary clauses, and clauses where the blocking literal is satisfied
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by blocker " << blocker << " in "
                                                << ca[i->cref] << std::endl;);
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            const Lit false_lit = ~p;
            if (c[0] == false_lit) {
                c[0] = c[1], c[1] = false_lit;
            }
            assert(c[1] == false_lit && "wrong literal order in the clause!");
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            const Watcher &w = Watcher(cr, first);            // updates the blocking literal
            if (first != blocker && value(first) == l_True) { // satisfied clause
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by other watch " << first << " in "
                                                << c << std::endl;);
                *j++ = w;
                continue;
            } // same as goto NextClause;

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False) {
                    DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] found new watch for the clause: " << c[k]
                                                    << " in " << c << std::endl;);
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                } // no need to indicate failure of lhbr, because remaining code is skipped in this case!

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) {
                    *j++ = *i++;
                }
                break;
            } else {
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] enqueue " << first << " with reason " << ca[cr] << std::endl;);
                uncheckedEnqueue(first);
            }
        NextClause:;
        }
        ws.shrink_(i - j); // remove all duplciate clauses!
    }
    DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate returns " << (confl != CRef_Undef) << std::endl;);
    return (confl != CRef_Undef); // return true, if something was found!
}